

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenVerifyCall
          (CSharpGenerator *this,CodeWriter *code_,FieldDef *field,char *prefix)

{
  int iVar1;
  FieldDef *pFVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  allocator<char> local_639;
  string local_638;
  Type local_618;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  string nfn;
  string local_510;
  Type local_4f0;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  string union_name;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *prefix_local;
  FieldDef *field_local;
  CodeWriter *code__local;
  CSharpGenerator *this_local;
  
  local_28 = prefix;
  prefix_local = (char *)field;
  field_local = (FieldDef *)code_;
  code__local = (CodeWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PRE",&local_49);
  pcVar4 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar4,&local_81);
  CodeWriter::SetValue(code_,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"NAME",&local_a9);
  ConvertCase(&local_d0,(string *)prefix_local,kUpperCamel,kSnake);
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"REQUIRED",&local_f1);
  bVar3 = FieldDef::IsRequired((FieldDef *)prefix_local);
  pcVar4 = "";
  if (bVar3) {
    pcVar4 = "Required";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar4,&local_119);
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"REQUIRED_FLAG",&local_141);
  bVar3 = FieldDef::IsRequired((FieldDef *)prefix_local);
  pcVar4 = "false";
  if (bVar3) {
    pcVar4 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar4,&local_169);
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_140,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"TYPE",&local_191);
  GenTypeGet_abi_cxx11_(&local_1b8,this,(Type *)(prefix_local + 200));
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"INLINESIZE",&local_1d9);
  sVar5 = InlineSize((Type *)(prefix_local + 200));
  NumToString<unsigned_long>(&local_200,sVar5);
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pFVar2 = field_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"OFFSET",&local_221);
  NumToString<unsigned_short>(&local_248,*(unsigned_short *)(prefix_local + 0x108));
  CodeWriter::SetValue((CodeWriter *)pFVar2,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  bVar3 = IsScalar(*(BaseType *)(prefix_local + 200));
  if ((bVar3) || (bVar3 = IsStruct((Type *)(prefix_local + 200)), bVar3)) {
    pFVar2 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"ALIGN",&local_269);
    sVar5 = InlineAlignment((Type *)(prefix_local + 200));
    NumToString<unsigned_long>(&local_290,sVar5);
    CodeWriter::SetValue((CodeWriter *)pFVar2,&local_268,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,
               "{{PRE}}      && verifier.VerifyField(tablePos, {{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, {{REQUIRED_FLAG}})"
               ,(allocator<char> *)(union_name.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=((CodeWriter *)field_local,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)(union_name.field_2._M_local_buf + 0xf));
  }
  pFVar2 = field_local;
  switch(*(undefined4 *)(prefix_local + 200)) {
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,
               "{{PRE}}      && verifier.VerifyString(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
               ,&local_431);
    CodeWriter::operator+=((CodeWriter *)field_local,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    break;
  case 0xe:
    iVar1 = *(int *)(prefix_local + 0xcc);
    if (iVar1 == 0xd) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,
                 "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, {{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})"
                 ,&local_459);
      CodeWriter::operator+=((CodeWriter *)field_local,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
    }
    else if (iVar1 == 0xf) {
      if ((*(byte *)(*(long *)(prefix_local + 0xd0) + 0x110) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,
                   "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
                   ,&local_481);
        CodeWriter::operator+=((CodeWriter *)field_local,&local_480);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"VECTOR_ELEM_INLINESIZE",&local_4a9);
        Type::VectorType(&local_4f0,(Type *)(prefix_local + 200));
        sVar5 = InlineSize(&local_4f0);
        NumToString<unsigned_long>(&local_4d0,sVar5);
        CodeWriter::SetValue((CodeWriter *)pFVar2,&local_4a8,&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator(&local_4a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_510,
                   "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                   ,(allocator<char> *)(nfn.field_2._M_local_buf + 0xf));
        CodeWriter::operator+=((CodeWriter *)field_local,&local_510);
        std::__cxx11::string::~string((string *)&local_510);
        std::allocator<char>::~allocator((allocator<char> *)(nfn.field_2._M_local_buf + 0xf));
      }
    }
    else if (iVar1 != 0x10) {
      GetNestedFlatBufferName_abi_cxx11_((string *)local_538,this,(FieldDef *)prefix_local);
      uVar6 = std::__cxx11::string::empty();
      pFVar2 = field_local;
      if ((uVar6 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_558,"CPP_NAME",&local_559);
        CodeWriter::SetValue((CodeWriter *)pFVar2,&local_558,(string *)local_538);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator(&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_580,
                   "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
                   ,&local_581);
        CodeWriter::operator+=((CodeWriter *)field_local,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::allocator<char>::~allocator(&local_581);
      }
      else if ((prefix_local[0x114] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d0,"VECTOR_ELEM_INLINESIZE",&local_5d1);
        Type::VectorType(&local_618,(Type *)(prefix_local + 200));
        sVar5 = InlineSize(&local_618);
        NumToString<unsigned_long>(&local_5f8,sVar5);
        CodeWriter::SetValue((CodeWriter *)pFVar2,&local_5d0,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::allocator<char>::~allocator(&local_5d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_638,
                   "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, {{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} /*{{TYPE}}*/, {{REQUIRED_FLAG}})"
                   ,&local_639);
        CodeWriter::operator+=((CodeWriter *)field_local,&local_638);
        std::__cxx11::string::~string((string *)&local_638);
        std::allocator<char>::~allocator(&local_639);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a8,
                   "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, {{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})"
                   ,&local_5a9);
        CodeWriter::operator+=((CodeWriter *)field_local,&local_5a8);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
      }
      std::__cxx11::string::~string((string *)local_538);
    }
    break;
  case 0xf:
    if ((*(byte *)(*(long *)(prefix_local + 0xd0) + 0x110) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,
                 "{{PRE}}      && verifier.VerifyTable(tablePos, {{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, {{REQUIRED_FLAG}})"
                 ,&local_409);
      CodeWriter::operator+=((CodeWriter *)field_local,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
    }
    break;
  case 0x10:
    NamespacedName_abi_cxx11_((string *)local_2d8,this,*(Definition **)(prefix_local + 0xd8));
    pFVar2 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"ENUM_NAME1",&local_2f9)
    ;
    CodeWriter::SetValue((CodeWriter *)pFVar2,&local_2f8,*(string **)(prefix_local + 0xd8));
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    pFVar2 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"ENUM_NAME",&local_321);
    CodeWriter::SetValue((CodeWriter *)pFVar2,&local_320,(string *)local_2d8);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    pFVar2 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"SUFFIX",&local_349);
    pcVar4 = UnionTypeFieldSuffix();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar4,&local_371);
    CodeWriter::SetValue((CodeWriter *)pFVar2,&local_348,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    pFVar2 = field_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"TYPE_ID_OFFSET",&local_399);
    NumToString<unsigned_long>(&local_3c0,(ulong)*(ushort *)(prefix_local + 0x108) - 2);
    CodeWriter::SetValue((CodeWriter *)pFVar2,&local_398,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,
               "{{PRE}}      && verifier.VerifyUnion(tablePos, {{TYPE_ID_OFFSET}}, {{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, {{REQUIRED_FLAG}})"
               ,&local_3e1);
    CodeWriter::operator+=((CodeWriter *)field_local,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)local_2d8);
  }
  return;
}

Assistant:

void GenVerifyCall(CodeWriter &code_, const FieldDef &field,
                     const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("NAME", ConvertCase(field.name, Case::kUpperCamel));
    code_.SetValue("REQUIRED", field.IsRequired() ? "Required" : "");
    code_.SetValue("REQUIRED_FLAG", field.IsRequired() ? "true" : "false");
    code_.SetValue("TYPE", GenTypeGet(field.value.type));
    code_.SetValue("INLINESIZE", NumToString(InlineSize(field.value.type)));
    code_.SetValue("OFFSET", NumToString(field.value.offset));

    if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type)) {
      code_.SetValue("ALIGN", NumToString(InlineAlignment(field.value.type)));
      code_ +=
          "{{PRE}}      && verifier.VerifyField(tablePos, "
          "{{OFFSET}} /*{{NAME}}*/, {{INLINESIZE}} /*{{TYPE}}*/, {{ALIGN}}, "
          "{{REQUIRED_FLAG}})";
    } else {
      // TODO - probably code below should go to this 'else' - code_ +=
      // "{{PRE}}VerifyOffset{{REQUIRED}}(verifier, {{OFFSET}})\\";
    }

    switch (field.value.type.base_type) {
      case BASE_TYPE_UNION: {
        auto union_name = NamespacedName(*field.value.type.enum_def);
        code_.SetValue("ENUM_NAME1", field.value.type.enum_def->name);
        code_.SetValue("ENUM_NAME", union_name);
        code_.SetValue("SUFFIX", UnionTypeFieldSuffix());
        // Caution: This construction assumes, that UNION type id element has
        // been created just before union data and its offset precedes union.
        // Such assumption is common in flatbuffer implementation
        code_.SetValue("TYPE_ID_OFFSET",
                       NumToString(field.value.offset - sizeof(voffset_t)));
        code_ +=
            "{{PRE}}      && verifier.VerifyUnion(tablePos, "
            "{{TYPE_ID_OFFSET}}, "
            "{{OFFSET}} /*{{NAME}}*/, {{ENUM_NAME}}Verify.Verify, "
            "{{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (!field.value.type.struct_def->fixed) {
          code_ +=
              "{{PRE}}      && verifier.VerifyTable(tablePos, "
              "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
              "{{REQUIRED_FLAG}})";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ +=
            "{{PRE}}      && verifier.VerifyString(tablePos, "
            "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
        break;
      }
      case BASE_TYPE_VECTOR: {
        switch (field.value.type.element) {
          case BASE_TYPE_STRING: {
            code_ +=
                "{{PRE}}      && verifier.VerifyVectorOfStrings(tablePos, "
                "{{OFFSET}} /*{{NAME}}*/, {{REQUIRED_FLAG}})";
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (!field.value.type.struct_def->fixed) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfTables(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{TYPE}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && "
                  "verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
          }
          case BASE_TYPE_UNION: {
            // Vectors of unions are not yet supported for go
            break;
          }
          default:
            // Generate verifier for vector of data.
            // It may be either nested flatbuffer of just vector of bytes
            auto nfn = GetNestedFlatBufferName(field);
            if (!nfn.empty()) {
              code_.SetValue("CPP_NAME", nfn);
              // FIXME: file_identifier.
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{CPP_NAME}}Verify.Verify, "
                  "{{REQUIRED_FLAG}})";
            } else if (field.flexbuffer) {
              code_ +=
                  "{{PRE}}      && verifier.VerifyNestedBuffer(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, null, {{REQUIRED_FLAG}})";
            } else {
              code_.SetValue(
                  "VECTOR_ELEM_INLINESIZE",
                  NumToString(InlineSize(field.value.type.VectorType())));
              code_ +=
                  "{{PRE}}      && verifier.VerifyVectorOfData(tablePos, "
                  "{{OFFSET}} /*{{NAME}}*/, {{VECTOR_ELEM_INLINESIZE}} "
                  "/*{{TYPE}}*/, {{REQUIRED_FLAG}})";
            }
            break;
        }

        break;
      }
      default: {
        break;
      }
    }
  }